

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindow.cpp
# Opt level: O0

QPoint __thiscall QWindow::framePosition(QWindow *this)

{
  long lVar1;
  int iVar2;
  QWindowPrivate *this_00;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QWindowPrivate *d;
  QMargins margins;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QPoint *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QPoint local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWindow *)0x42ffca);
  if (this_00->platformWindow == (QPlatformWindow *)0x0) {
    local_48 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                             );
  }
  else {
    frameMargins((QWindow *)this_00);
    (*(this_00->platformWindow->super_QPlatformSurface)._vptr_QPlatformSurface[6])();
    QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QHighDpi::fromNativeWindowGeometry<QPoint,QWindow>
              (in_RDI,(QWindow *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar2 = QMargins::left((QMargins *)0x430057);
    QMargins::top((QMargins *)0x430065);
    QPoint::QPoint(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    local_48 = ::operator-(in_RDI,(QPoint *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QWindow::framePosition() const
{
    Q_D(const QWindow);
    if (d->platformWindow) {
        QMargins margins = frameMargins();
        return QHighDpi::fromNativeWindowGeometry(d->platformWindow->geometry().topLeft(), this) - QPoint(margins.left(), margins.top());
    }
    return d->geometry.topLeft();
}